

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanQuotedScalar(Scanner *this)

{
  int iVar1;
  pointer pRVar2;
  char ch;
  RegEx *ex;
  ScanScalarParams *params;
  undefined1 uVar3;
  RegEx end;
  string scalar;
  undefined1 local_110 [48];
  RegEx local_e0;
  char *local_c0;
  _Elt_pointer local_b8;
  char local_b0 [16];
  _Alloc_hider local_a0;
  undefined1 local_98 [16];
  string local_88 [8];
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [32];
  RegEx local_48;
  
  local_b8 = (_Elt_pointer)0x0;
  local_b0[0] = '\0';
  local_c0 = local_b0;
  ch = YAML::Stream::peek(&this->INPUT);
  params = (ScanScalarParams *)0x0;
  local_110[0x12] = 0;
  local_110._16_2_ = 0;
  local_110[0x28] = 0;
  local_110._36_4_ = 0;
  if (ch == '\'') {
    RegEx::RegEx((RegEx *)&local_a0,'\'');
    ex = Exp::EscSingleQuote();
    operator!(&local_48,ex);
    operator&((RegEx *)(local_110 + 0x30),(RegEx *)&local_a0,&local_48);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector
              ((vector<YAML::RegEx,_std::allocator<YAML::RegEx>_> *)local_98);
    uVar3 = 0x27;
  }
  else {
    uVar3 = 0x5c;
    RegEx::RegEx((RegEx *)(local_110 + 0x30),ch);
  }
  local_110._0_8_ = local_110 + 0x30;
  local_110[8] = 1;
  local_110._12_4_ = 0;
  local_110._20_4_ = utf16be;
  local_110[0x11] = 1;
  local_110[0x18] = 0;
  local_110._28_8_ = 0x200000000;
  local_110[0x12] = uVar3;
  InsertPotentialSimpleKey(this);
  pRVar2 = *(pointer *)&(this->INPUT).m_mark;
  iVar1 = (this->INPUT).m_mark.column;
  YAML::Stream::get(&this->INPUT);
  ScanScalar_abi_cxx11_((string *)&local_a0,(YAML *)this,(Stream *)local_110,params);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
  if (local_a0._M_p != local_98 + 8) {
    operator_delete(local_a0._M_p);
  }
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = true;
  local_a0._M_p = (pointer)0x1400000000;
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  local_68._0_8_ = (pointer)0x0;
  local_68._8_4_ = 0;
  local_68._12_4_ = 0;
  local_68._16_4_ = 0;
  local_68._20_8_ = 0;
  local_98._0_8_ = pRVar2;
  local_98._8_4_ = iVar1;
  local_88 = (string  [8])&local_78;
  std::__cxx11::string::_M_assign(local_88);
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  if (local_88 != (string  [8])&local_78) {
    operator_delete((void *)local_88);
  }
  std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector
            ((vector<YAML::RegEx,_std::allocator<YAML::RegEx>_> *)(local_110 + 0x38));
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  return;
}

Assistant:

void Scanner::ScanQuotedScalar() {
  std::string scalar;

  // peek at single or double quote (don't eat because we need to preserve (for
  // the time being) the input position)
  char quote = INPUT.peek();
  bool single = (quote == '\'');

  // setup the scanning parameters
  ScanScalarParams params;
  RegEx end = (single ? RegEx(quote) & !Exp::EscSingleQuote() : RegEx(quote));
  params.end = &end;
  params.eatEnd = true;
  params.escape = (single ? '\'' : '\\');
  params.indent = 0;
  params.fold = FOLD_FLOW;
  params.eatLeadingWhitespace = true;
  params.trimTrailingSpaces = false;
  params.chomp = CLIP;
  params.onDocIndicator = THROW;

  // insert a potential simple key
  InsertPotentialSimpleKey();

  Mark mark = INPUT.mark();

  // now eat that opening quote
  INPUT.get();

  // and scan
  scalar = ScanScalar(INPUT, params);
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  Token token(Token::NON_PLAIN_SCALAR, mark);
  token.value = scalar;
  m_tokens.push(token);
}